

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_login(connectdata *conn)

{
  char *pcVar1;
  char *pcVar2;
  char *local_50;
  char *local_40;
  char *passwd;
  char *user;
  CURLcode result;
  connectdata *conn_local;
  
  if (((conn->bits).user_passwd & 1U) == 0) {
    state(conn,IMAP_STOP);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    pcVar1 = imap_atom(conn->user,false);
    pcVar2 = imap_atom(conn->passwd,false);
    local_40 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      local_40 = "";
    }
    local_50 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      local_50 = "";
    }
    conn_local._4_4_ = imap_sendf(conn,"LOGIN %s %s",local_40,local_50);
    (*Curl_cfree)(pcVar1);
    (*Curl_cfree)(pcVar2);
    if (conn_local._4_4_ == CURLE_OK) {
      state(conn,IMAP_LOGIN);
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_login(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  char *user;
  char *passwd;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, IMAP_STOP);

    return result;
  }

  /* Make sure the username and password are in the correct atom format */
  user = imap_atom(conn->user, false);
  passwd = imap_atom(conn->passwd, false);

  /* Send the LOGIN command */
  result = imap_sendf(conn, "LOGIN %s %s", user ? user : "",
                      passwd ? passwd : "");

  free(user);
  free(passwd);

  if(!result)
    state(conn, IMAP_LOGIN);

  return result;
}